

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_access.cpp
# Opt level: O0

int embree::main(int argc,char **argv)

{
  RTCDevice device_i;
  RTCScene scene_i;
  RTCScene scene;
  RTCDevice device;
  undefined8 uVar1;
  RTCError in_stack_fffffffffffffeac;
  void *in_stack_fffffffffffffeb0;
  RTCScene scene_i_00;
  Vec3fa *in_stack_fffffffffffffec0;
  RTCDevice device_i_00;
  RTCScene in_stack_fffffffffffffec8;
  RTCScene scene_i_01;
  RTCDevice in_stack_fffffffffffffed0;
  RTCDevice device_i_01;
  undefined4 uVar2;
  undefined4 uVar3;
  
  MXCSR = MXCSR | 0x8040;
  device_i = (RTCDevice)rtcNewDevice("tri_accel=bvh4.triangle4v");
  rtcGetDeviceError(device_i);
  uVar1 = 0;
  error_handler(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,(char *)0x0);
  rtcSetDeviceErrorFunction(device_i,error_handler,uVar1);
  scene_i = (RTCScene)rtcNewScene(device_i);
  uVar3 = 0xbf800000;
  uVar2 = 0;
  addCube(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  scene_i_01 = (RTCScene)0x3f800000;
  device_i_01 = (RTCDevice)0x0;
  addCube((RTCDevice)0x0,(RTCScene)0x3f800000,in_stack_fffffffffffffec0);
  scene_i_00 = (RTCScene)0x0;
  device_i_00 = (RTCDevice)0xbf800000;
  addCube(device_i_01,scene_i_01,(Vec3fa *)0xbf800000);
  addCube(device_i_01,scene_i_01,(Vec3fa *)device_i_00);
  addHair(device_i,scene_i);
  addGroundPlane(device_i_00,scene_i_00);
  rtcCommitScene(scene_i);
  print_bvh((RTCScene)CONCAT44(uVar3,uVar2));
  rtcReleaseScene(scene_i);
  rtcReleaseDevice(device_i);
  waitForKeyPressedUnderWindows();
  return 0;
}

Assistant:

int main(int argc, char** argv) 
  {
    /* for best performance set FTZ and DAZ flags in MXCSR control and status register */
    _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_ON);
    _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_ON);

    /* create new Embree device and force bvh4.triangle4v hierarchy for triangles */
    RTCDevice device = rtcNewDevice("tri_accel=bvh4.triangle4v");
    error_handler(nullptr,rtcGetDeviceError(device));
    
    /* set error handler */
    rtcSetDeviceErrorFunction(device,error_handler,nullptr);
    
    /* create scene */
    RTCScene scene = rtcNewScene(device);
    addCube(device,scene,Vec3fa(-1,0,0));
    addCube(device,scene,Vec3fa(1,0,0));
    addCube(device,scene,Vec3fa(0,0,-1));
    addCube(device,scene,Vec3fa(0,0,1));
    addHair(device,scene);
    addGroundPlane(device,scene);
    rtcCommitScene (scene);
    /* print triangle BVH */
    print_bvh(scene);

    /* cleanup */
    rtcReleaseScene (scene);
    rtcReleaseDevice(device);

    /* wait for user input under Windows when opened in separate window */
    waitForKeyPressedUnderWindows();
    
    return 0;
  }